

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O1

bool arangodb::velocypack::Collection::contains(Slice slice,Slice other)

{
  bool bVar1;
  bool bVar2;
  ArrayIterator it;
  uint8_t *local_50;
  uint8_t *local_48;
  ArrayIterator local_40;
  
  local_48 = other._start;
  ArrayIterator::ArrayIterator(&local_40,slice);
  bVar2 = local_40._position != local_40._size;
  if (bVar2) {
    local_50 = (uint8_t *)ArrayIterator::value(&local_40);
    bVar1 = SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
            binaryEquals<arangodb::velocypack::Slice,arangodb::velocypack::Slice>
                      ((SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)
                       &local_50,
                       (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_48);
    if (!bVar1) {
      do {
        ArrayIterator::next(&local_40);
        bVar2 = local_40._position != local_40._size;
        if (local_40._position == local_40._size) {
          return bVar2;
        }
        local_50 = (uint8_t *)ArrayIterator::value(&local_40);
        bVar1 = SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
                binaryEquals<arangodb::velocypack::Slice,arangodb::velocypack::Slice>
                          ((SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)
                           &local_50,
                           (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           &local_48);
      } while (!bVar1);
    }
  }
  return bVar2;
}

Assistant:

bool Collection::contains(Slice slice, Slice other) {
  ArrayIterator it(slice);

  while (it.valid()) {
    if (it.value().binaryEquals(other)) {
      return true;
    }
    it.next();
  }

  return false;
}